

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O0

void __thiscall kj::TestCase101::run(TestCase101 *this)

{
  bool bVar1;
  Tag TVar2;
  OneOf<int,_float,_const_char_*> *pOVar3;
  float *params_1;
  char **ppcVar4;
  OneOf<int,_float,_const_char_*> *extraout_RDX;
  OneOf<int,_float,_const_char_*> *extraout_RDX_00;
  OneOf<int,_float,_const_char_*> *extraout_RDX_01;
  ArrayPtr<const_char> AVar5;
  Fault local_288;
  Fault f_5;
  float *_kj_switch_done_8;
  float *n_2;
  undefined1 local_268 [7];
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_258;
  undefined1 local_248 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition_3;
  char **_kj_switch_done_7;
  char **s_2;
  Fault f_4;
  int *_kj_switch_done_6;
  int *i_2;
  OneOf<int,_float,_const_char_*> *_kj_switch_subject_2;
  OneOf<int,_float,_const_char_*> *constVar;
  Fault f_3;
  float *_kj_switch_done_5;
  float *n_1;
  undefined1 local_1c0 [7];
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_1b0;
  undefined1 local_1a0 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition_2;
  char **_kj_switch_done_4;
  char **s_1;
  Fault local_158;
  Fault f_2;
  int *_kj_switch_done_3;
  int *i_1;
  undefined1 local_130 [8];
  NullableValue<kj::OneOf<int,_float,_const_char_*>_> _kj_switch_subject_1;
  bool _kj_shouldLog_1;
  DebugExpression<unsigned_int_&> DStack_110;
  undefined1 local_108 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_1;
  Fault f_1;
  float *_kj_switch_done_2;
  float *n;
  undefined1 local_c0 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_b0;
  undefined1 local_a0 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition;
  char **_kj_switch_done_1;
  char **s;
  Fault f;
  int *_kj_switch_done;
  int *i;
  OneOf<int,_float,_const_char_*> *_kj_switch_subject;
  uint count;
  OneOf<int,_float,_const_char_*> local_30;
  undefined1 local_20 [8];
  OneOf<int,_float,_const_char_*> var;
  TestCase101 *this_local;
  
  var.field_1 = (anon_union_8_1_a8a2e026_for_OneOf<int,_float,_const_char_*>_2)this;
  OneOf<int,_float,_const_char_*>::OneOf((OneOf<int,_float,_const_char_*> *)local_20);
  OneOf<int,float,char_const*>::OneOf<char_const(&)[4],int>
            ((OneOf<int,float,char_const*> *)&local_30,(char (*) [4])0x9422c6);
  OneOf<int,_float,_const_char_*>::operator=((OneOf<int,_float,_const_char_*> *)local_20,&local_30);
  OneOf<int,_float,_const_char_*>::~OneOf(&local_30);
  _kj_switch_subject._0_4_ = 0;
  pOVar3 = OneOf<int,_float,_const_char_*>::_switchSubject
                     ((OneOf<int,_float,_const_char_*> *)local_20);
  TVar2 = OneOf<int,_float,_const_char_*>::which(pOVar3);
  if (TVar2 == _variant0) {
    f.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<int>(pOVar3);
    if (f.exception != (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                ((Fault *)&s,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x6d,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)f.exception);
      kj::_::Debug::Fault::fatal((Fault *)&s);
    }
    f.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant1) {
    params_1 = OneOf<int,_float,_const_char_*>::get<float>(pOVar3);
    if (params_1 != (float *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                ((Fault *)&_kjCondition_1.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x74,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",params_1);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
    }
  }
  else if (TVar2 == _variant2) {
    ppcVar4 = OneOf<int,float,char_const*>::get<char_const*>((OneOf<int,float,char_const*> *)pOVar3)
    ;
    _kjCondition._40_8_ = ppcVar4;
    while (_kjCondition._40_8_ != 0) {
      StringPtr::StringPtr((StringPtr *)local_c0,*ppcVar4);
      AVar5 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)local_c0);
      local_b0 = AVar5;
      kj::_::DebugExpression<kj::StringPtr>::operator==
                ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_a0,
                 (DebugExpression<kj::StringPtr> *)&local_b0,(char (*) [4])0x9422c6);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
      if (!bVar1) {
        n._7_1_ = kj::_::Debug::shouldLog(ERROR);
        while (n._7_1_ != false) {
          kj::_::Debug::
          log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                     ,0x70,ERROR,
                     "\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition",
                     (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",
                     (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_a0);
          n._7_1_ = false;
        }
      }
      _kj_switch_subject._0_4_ = (int)_kj_switch_subject + 1;
      _kjCondition.result = false;
      _kjCondition._41_7_ = 0;
    }
  }
  DStack_110 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&_kj_switch_subject);
  _kj_switch_subject_1.field_1._12_4_ = 1;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_108,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffef0,
             (int *)((long)&_kj_switch_subject_1.field_1 + 0xc));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
  pOVar3 = extraout_RDX;
  if (!bVar1) {
    _kj_switch_subject_1.field_1._11_1_ = kj::_::Debug::shouldLog(ERROR);
    pOVar3 = extraout_RDX_00;
    while (_kj_switch_subject_1.field_1._11_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x79,ERROR,"\"failed: expected \" \"count == 1\", _kjCondition",
                 (char (*) [28])"failed: expected count == 1",
                 (DebugComparison<unsigned_int_&,_int> *)local_108);
      pOVar3 = extraout_RDX_01;
      _kj_switch_subject_1.field_1._11_1_ = 0;
    }
  }
  cp<kj::OneOf<int,float,char_const*>>
            ((OneOf<int,_float,_const_char_*> *)&i_1,(kj *)local_20,pOVar3);
  OneOf<int,_float,_const_char_*>::_switchSubject
            ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_130,
             (OneOf<int,_float,_const_char_*> *)&i_1);
  OneOf<int,_float,_const_char_*>::~OneOf((OneOf<int,_float,_const_char_*> *)&i_1);
  pOVar3 = kj::_::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                     ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_130);
  TVar2 = OneOf<int,_float,_const_char_*>::which(pOVar3);
  if (TVar2 == _variant0) {
    pOVar3 = kj::_::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                       ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_130);
    f_2.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<int>(pOVar3);
    if (f_2.exception != (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int&>
                (&local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x7e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)f_2.exception);
      kj::_::Debug::Fault::fatal(&local_158);
    }
    f_2.exception = (Exception *)0x0;
  }
  else {
    if (TVar2 == _variant1) {
      pOVar3 = kj::_::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                         ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_130);
      f_3.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<float>(pOVar3);
      if (f_3.exception != (Exception *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float&>
                  ((Fault *)&constVar,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                   ,0x84,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                   (char (*) [26])"expected char*, got float",(float *)f_3.exception);
        kj::_::Debug::Fault::fatal((Fault *)&constVar);
      }
      f_3.exception = (Exception *)0x0;
    }
    else if (TVar2 == _variant2) {
      pOVar3 = kj::_::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::operator->
                         ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_130);
      ppcVar4 = OneOf<int,float,char_const*>::get<char_const*>
                          ((OneOf<int,float,char_const*> *)pOVar3);
      _kjCondition_2._40_8_ = ppcVar4;
      while (_kjCondition_2._40_8_ != 0) {
        StringPtr::StringPtr((StringPtr *)local_1c0,*ppcVar4);
        AVar5 = (ArrayPtr<const_char>)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)local_1c0);
        local_1b0 = AVar5;
        kj::_::DebugExpression<kj::StringPtr>::operator==
                  ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_1a0,
                   (DebugExpression<kj::StringPtr> *)&local_1b0,(char (*) [4])0x9422c6);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a0);
        if (!bVar1) {
          n_1._7_1_ = kj::_::Debug::shouldLog(ERROR);
          while (n_1._7_1_ != false) {
            kj::_::Debug::
            log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                       ,0x81,ERROR,
                       "\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition",
                       (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",
                       (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_1a0);
            n_1._7_1_ = false;
          }
        }
        _kjCondition_2.result = false;
        _kjCondition_2._41_7_ = 0;
      }
      goto LAB_0040ab18;
    }
  }
LAB_0040ab18:
  kj::_::NullableValue<kj::OneOf<int,_float,_const_char_*>_>::~NullableValue
            ((NullableValue<kj::OneOf<int,_float,_const_char_*>_> *)local_130);
  pOVar3 = OneOf<int,_float,_const_char_*>::_switchSubject
                     ((OneOf<int,_float,_const_char_*> *)local_20);
  TVar2 = OneOf<int,_float,_const_char_*>::which(pOVar3);
  if (TVar2 == _variant0) {
    f_4.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<int>(pOVar3);
    if (f_4.exception != (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24],int_const&>
                ((Fault *)&s_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x8e,FAILED,(char *)0x0,"\"expected char*, got int\", i",
                 (char (*) [24])"expected char*, got int",(int *)f_4.exception);
      kj::_::Debug::Fault::fatal((Fault *)&s_2);
    }
    f_4.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant1) {
    f_5.exception = (Exception *)OneOf<int,_float,_const_char_*>::get<float>(pOVar3);
    if (f_5.exception != (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],float_const&>
                (&local_288,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x94,FAILED,(char *)0x0,"\"expected char*, got float\", n",
                 (char (*) [26])"expected char*, got float",(float *)f_5.exception);
      kj::_::Debug::Fault::fatal(&local_288);
    }
    f_5.exception = (Exception *)0x0;
  }
  else if (TVar2 == _variant2) {
    ppcVar4 = OneOf<int,float,char_const*>::get<char_const*>((OneOf<int,float,char_const*> *)pOVar3)
    ;
    _kjCondition_3._40_8_ = ppcVar4;
    while (_kjCondition_3._40_8_ != 0) {
      StringPtr::StringPtr((StringPtr *)local_268,*ppcVar4);
      AVar5 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)local_268);
      local_258 = AVar5;
      kj::_::DebugExpression<kj::StringPtr>::operator==
                ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_248,
                 (DebugExpression<kj::StringPtr> *)&local_258,(char (*) [4])0x9422c6);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_248);
      if (!bVar1) {
        n_2._7_1_ = kj::_::Debug::shouldLog(ERROR);
        while (n_2._7_1_ != false) {
          kj::_::Debug::
          log<char_const(&)[43],kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/one-of-test.c++"
                     ,0x91,ERROR,
                     "\"failed: expected \" \"kj::StringPtr(s) == \\\"foo\\\"\", _kjCondition",
                     (char (*) [43])"failed: expected kj::StringPtr(s) == \"foo\"",
                     (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_248);
          n_2._7_1_ = false;
        }
      }
      _kjCondition_3.result = false;
      _kjCondition_3._41_7_ = 0;
    }
  }
  OneOf<int,_float,_const_char_*>::~OneOf((OneOf<int,_float,_const_char_*> *)local_20);
  return;
}

Assistant:

TEST(OneOf, Switch) {
  OneOf<int, float, const char*> var;
  var = "foo";
  uint count = 0;

  {
    KJ_SWITCH_ONEOF(var) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
        ++count;
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  KJ_EXPECT(count == 1);

  {
    KJ_SWITCH_ONEOF(kj::cp(var)) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }

  {
    // At one time this failed to compile.
    const auto& constVar = var;
    KJ_SWITCH_ONEOF(constVar) {
      KJ_CASE_ONEOF(i, int) {
        KJ_FAIL_ASSERT("expected char*, got int", i);
      }
      KJ_CASE_ONEOF(s, const char*) {
        KJ_EXPECT(kj::StringPtr(s) == "foo");
      }
      KJ_CASE_ONEOF(n, float) {
        KJ_FAIL_ASSERT("expected char*, got float", n);
      }
    }
  }
}